

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

wchar_t * fmt::v8::detail::
          parse_precision<wchar_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<wchar_t>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v8::detail::specs_handler<wchar_t>_> *handler)

{
  int iVar1;
  wchar_t *begin_00;
  wchar_t *local_28;
  precision_adapter local_20;
  
  local_28 = begin + 1;
  if (local_28 != end) {
    if ((uint)(*local_28 + L'\xffffffd0') < 10) {
      iVar1 = parse_nonnegative_int<wchar_t>(&local_28,end,-1);
      if (iVar1 == -1) {
        fmt::v8::detail::throw_format_error("number is too big");
      }
      ((handler->super_specs_handler<wchar_t>).super_specs_setter<wchar_t>.specs_)->precision =
           iVar1;
    }
    else {
      if (*local_28 != L'{') goto LAB_001a946e;
      begin_00 = begin + 2;
      if (begin_00 != end) {
        local_20.handler = handler;
        if ((*begin_00 == L':') || (*begin_00 == L'}')) {
          specs_handler<wchar_t>::on_dynamic_precision<fmt::v8::detail::auto_id>
                    (&handler->super_specs_handler<wchar_t>);
        }
        else {
          begin_00 = do_parse_arg_id<wchar_t,fmt::v8::detail::parse_precision<wchar_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<wchar_t>>&>(wchar_t_const*,wchar_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<wchar_t>>&)::precision_adapter&>
                               (begin_00,end,&local_20);
        }
      }
      if ((begin_00 == end) || (local_28 = begin_00 + 1, *begin_00 != L'}')) {
        fmt::v8::detail::throw_format_error("invalid format string");
      }
    }
    specs_checker<fmt::v8::detail::specs_handler<wchar_t>_>::end_precision(handler);
    return local_28;
  }
LAB_001a946e:
  fmt::v8::detail::throw_format_error("missing precision specifier");
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}